

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O2

string * __thiscall
gl4cts::EnhancedLayouts::TextureTestBase::getVerificationSnippet_abi_cxx11_
          (string *__return_storage_ptr__,TextureTestBase *this,GLuint param_1,
          ProgramInterface *program_interface,STAGES stage)

{
  Variable *pVVar1;
  ShaderInterface *pSVar2;
  pointer ppVVar3;
  pointer ppVVar4;
  uint uVar5;
  size_t position;
  string verification;
  allocator<char> local_a5;
  FLAVOUR local_a4;
  size_t local_a0;
  string local_98;
  string local_78;
  string *local_58;
  string local_50;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_98,"if (LIST)\n    {\n        result = 0u;\n    }\n",
             (allocator<char> *)&local_78);
  local_a4 = BASIC;
  if (stage - TESS_CTRL < 3) {
    local_a4 = *(FLAVOUR *)(&DAT_0165218c + (ulong)(stage - TESS_CTRL) * 4);
  }
  pSVar2 = Utils::ProgramInterface::GetShaderInterface(program_interface,stage);
  ppVVar3 = (pSVar2->m_inputs).
            super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  ppVVar4 = (pSVar2->m_inputs).
            super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (((ppVVar4 == ppVVar3) &&
      ((pSVar2->m_uniforms).
       super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
       ._M_impl.super__Vector_impl_data._M_finish ==
       (pSVar2->m_uniforms).
       super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
       ._M_impl.super__Vector_impl_data._M_start)) &&
     ((pSVar2->m_ssb_blocks).
      super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
      ._M_impl.super__Vector_impl_data._M_finish ==
      (pSVar2->m_ssb_blocks).
      super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
      ._M_impl.super__Vector_impl_data._M_start)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,glcts::fixed_sample_locations_values + 1,
               (allocator<char> *)&local_78);
  }
  else {
    local_a0 = 0;
    local_58 = __return_storage_ptr__;
    for (uVar5 = 0; (ulong)uVar5 < (ulong)((long)ppVVar4 - (long)ppVVar3 >> 3); uVar5 = uVar5 + 1) {
      pVVar1 = ppVVar3[uVar5];
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,glcts::fixed_sample_locations_values + 1,&local_a5);
      getVariableVerifcation(&local_78,this,&local_50,pVVar1->m_data,&pVVar1->m_descriptor,local_a4)
      ;
      std::__cxx11::string::~string((string *)&local_50);
      Utils::insertElementOfList(local_78._M_dataplus._M_p," ||\n        ",&local_a0,&local_98);
      std::__cxx11::string::~string((string *)&local_78);
      ppVVar3 = (pSVar2->m_inputs).
                super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVVar4 = (pSVar2->m_inputs).
                super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    }
    uVar5 = 0;
    while( true ) {
      ppVVar3 = (pSVar2->m_uniforms).
                super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(pSVar2->m_uniforms).
                        super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppVVar3 >> 3) <=
          (ulong)uVar5) break;
      pVVar1 = ppVVar3[uVar5];
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,glcts::fixed_sample_locations_values + 1,&local_a5);
      getVariableVerifcation(&local_78,this,&local_50,pVVar1->m_data,&pVVar1->m_descriptor,BASIC);
      std::__cxx11::string::~string((string *)&local_50);
      Utils::insertElementOfList(local_78._M_dataplus._M_p," ||\n        ",&local_a0,&local_98);
      std::__cxx11::string::~string((string *)&local_78);
      uVar5 = uVar5 + 1;
    }
    uVar5 = 0;
    while( true ) {
      ppVVar3 = (pSVar2->m_ssb_blocks).
                super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(pSVar2->m_ssb_blocks).
                        super__Vector_base<gl4cts::EnhancedLayouts::Utils::Variable_*,_std::allocator<gl4cts::EnhancedLayouts::Utils::Variable_*>_>
                        ._M_impl.super__Vector_impl_data._M_finish - (long)ppVVar3 >> 3) <=
          (ulong)uVar5) break;
      pVVar1 = ppVVar3[uVar5];
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_50,glcts::fixed_sample_locations_values + 1,&local_a5);
      getVariableVerifcation(&local_78,this,&local_50,pVVar1->m_data,&pVVar1->m_descriptor,BASIC);
      std::__cxx11::string::~string((string *)&local_50);
      Utils::insertElementOfList(local_78._M_dataplus._M_p," ||\n        ",&local_a0,&local_98);
      std::__cxx11::string::~string((string *)&local_78);
      uVar5 = uVar5 + 1;
    }
    Utils::endList(glcts::fixed_sample_locations_values + 1,&local_a0,&local_98);
    (local_58->_M_dataplus)._M_p = (pointer)&local_58->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p == &local_98.field_2) {
      (local_58->field_2)._M_allocated_capacity =
           CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,local_98.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&local_58->field_2 + 8) = local_98.field_2._8_8_;
    }
    else {
      (local_58->_M_dataplus)._M_p = local_98._M_dataplus._M_p;
      (local_58->field_2)._M_allocated_capacity =
           CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,local_98.field_2._M_local_buf[0]);
    }
    local_58->_M_string_length = local_98._M_string_length;
    local_98._M_string_length = 0;
    local_98.field_2._M_local_buf[0] = '\0';
    __return_storage_ptr__ = local_58;
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  }
  std::__cxx11::string::~string((string *)&local_98);
  return __return_storage_ptr__;
}

Assistant:

std::string TextureTestBase::getVerificationSnippet(GLuint /* test_case_index */,
													Utils::ProgramInterface& program_interface,
													Utils::Shader::STAGES	stage)
{
	static const GLchar* separator = " ||\n        ";

	std::string verification = "if (LIST)\n"
							   "    {\n"
							   "        result = 0u;\n"
							   "    }\n";

	/* Get flavour of in and out variables */
	Utils::Variable::FLAVOUR in_flavour = Utils::Variable::GetFlavour(stage, Utils::Variable::INPUT);

	/* Get interface for shader stage */
	Utils::ShaderInterface& si = program_interface.GetShaderInterface(stage);

	/* There are no varialbes to verify */
	if ((0 == si.m_inputs.size()) && (0 == si.m_uniforms.size()) && (0 == si.m_ssb_blocks.size()))
	{
		return "";
	}

	/* For each in variable insert verification code */
	size_t position = 0;

	for (GLuint i = 0; i < si.m_inputs.size(); ++i)
	{
		const Utils::Variable& var				= *si.m_inputs[i];
		const std::string&	 var_verification = getVariableVerifcation("", var.m_data, var.m_descriptor, in_flavour);

		Utils::insertElementOfList(var_verification.c_str(), separator, position, verification);
	}

	/* For each unifrom variable insert verification code */
	for (GLuint i = 0; i < si.m_uniforms.size(); ++i)
	{
		const Utils::Variable& var = *si.m_uniforms[i];
		const std::string&	 var_verification =
			getVariableVerifcation("", var.m_data, var.m_descriptor, Utils::Variable::BASIC);

		Utils::insertElementOfList(var_verification.c_str(), separator, position, verification);
	}

	/* For each ssb variable insert verification code */
	for (GLuint i = 0; i < si.m_ssb_blocks.size(); ++i)
	{
		const Utils::Variable& var = *si.m_ssb_blocks[i];
		const std::string&	 var_verification =
			getVariableVerifcation("", var.m_data, var.m_descriptor, Utils::Variable::BASIC);

		Utils::insertElementOfList(var_verification.c_str(), separator, position, verification);
	}

	Utils::endList("", position, verification);

#if DEBUG_TTB_VERIFICATION_SNIPPET_STAGE

	{
		GLchar buffer[16];
		sprintf(buffer, "%d", stage + 10);
		Utils::replaceToken("0u", position, buffer, verification);
	}

#elif DEBUG_TTB_VERIFICATION_SNIPPET_VARIABLE

	if (Utils::Shader::VERTEX == stage)
	{
		Utils::replaceToken("0u", position, "in_vs_first.x", verification);
	}
	else
	{
		Utils::replaceToken("0u", position, "31u", verification);
	}

#endif

	/* Done */
	return verification;
}